

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::Write
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,TPZStream *buf,
          int withclassid)

{
  uint in_EDX;
  TPZQuadSphere<pzgeom::TPZGeoQuad> *in_RSI;
  TPZStream *in_RDI;
  TPZGeoEl *unaff_retaddr;
  uint i;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar1;
  
  TPZGeoEl::Write(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::Write
            (in_RSI,(TPZStream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (int)((ulong)in_RDI >> 0x20));
  for (uVar1 = 0; uVar1 < 9; uVar1 = uVar1 + 1) {
    (*in_RDI[(ulong)uVar1 * 3 + 0x12]._vptr_TPZStream[5])
              (in_RDI + (ulong)uVar1 * 3 + 0x12,in_RSI,(ulong)in_EDX);
  }
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Write(TPZStream &buf, int withclassid) const {
    TPZGeoEl::Write(buf, withclassid);
    fGeo.Write(buf, withclassid);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Write(buf, withclassid);
    }
}